

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Intercom_Control_PDU::Intercom_Control_PDU(Intercom_Control_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Intercom_Control_PDU_00217b58;
  (this->super_Header).super_Header6.field_0x27 = 0;
  DATA_TYPE::CommunicationsChannelType::CommunicationsChannelType(&this->m_CommChannelType);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_SrcEnt);
  this->m_ui8TransmitLineState = '\0';
  this->m_ui8Command = '\0';
  this->m_ui16SrcCommDevID = 0;
  this->m_ui8SrcLineID = '\0';
  this->m_ui8TransmitPriority = '\0';
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_MstrEntID);
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui16MstrCommDeviceID = 0;
  this->m_ui16MstrChannelID = 0;
  this->m_ui32IntrParamLen = 0;
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = ' ';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x04';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Intercom_Control_PDU::Intercom_Control_PDU() :
    m_ui8CtrlTyp( 0 ),
    m_ui16SrcCommDevID( 0 ),
    m_ui8SrcLineID( 0 ),
    m_ui8TransmitPriority( 0 ),
    m_ui8TransmitLineState( 0 ),
    m_ui8Command( 0 ),
    m_ui16MstrCommDeviceID( 0 ),
    m_ui16MstrChannelID( 0 ),
    m_ui32IntrParamLen( 0 )
{
    m_ui8PDUType = IntercomControl_PDU_Type;
    m_ui8ProtocolFamily = Radio_Communications;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui16PDULength = INTERCOM_CONTROL_PDU_SIZE;
}